

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statisticspooling.cpp
# Opt level: O0

int __thiscall
ncnn::StatisticsPooling::forward(StatisticsPooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float *pfVar1;
  Mat *in_RDX;
  long in_RSI;
  long in_RDI;
  float fVar2;
  __type _Var3;
  double dVar4;
  int i_1;
  float std;
  float *ptr_1;
  int q_1;
  int i;
  float mean;
  float *ptr;
  int q;
  int out_channels;
  size_t elemsize;
  int size;
  int channels;
  int h;
  int w;
  float in_stack_fffffffffffffee4;
  Mat *in_stack_fffffffffffffee8;
  Mat *pMVar5;
  size_t in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffefc;
  Mat *in_stack_ffffffffffffff00;
  int local_f0;
  float local_ec;
  Mat local_e8;
  float *local_a8;
  int local_a0;
  int local_9c;
  float local_98;
  Mat local_88;
  float *local_48;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  Mat *local_18;
  
  local_24 = *(int *)(in_RSI + 0x2c);
  local_28 = *(int *)(in_RSI + 0x30);
  local_2c = *(int *)(in_RSI + 0x34);
  local_30 = local_24 * local_28;
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = local_2c;
  if (*(int *)(in_RDI + 0xb8) != 0) {
    local_3c = local_2c << 1;
  }
  local_18 = in_RDX;
  ncnn::Mat::create(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc,in_stack_fffffffffffffef0,
                    (Allocator *)in_stack_fffffffffffffee8);
  for (local_40 = 0; local_40 < local_2c; local_40 = local_40 + 1) {
    pMVar5 = &local_88;
    ncnn::Mat::channel(in_stack_fffffffffffffee8,(int)in_stack_fffffffffffffee4);
    pfVar1 = ncnn::Mat::operator_cast_to_float_(pMVar5);
    ncnn::Mat::~Mat((Mat *)0x204e2c);
    local_98 = 0.0;
    for (local_9c = 0; local_9c < local_30; local_9c = local_9c + 1) {
      local_98 = pfVar1[local_9c] + local_98;
    }
    fVar2 = (local_98 / (float)local_24) / (float)local_28;
    local_48 = pfVar1;
    pfVar1 = ncnn::Mat::operator[](local_18,(long)local_40);
    *pfVar1 = fVar2;
  }
  for (local_a0 = local_2c; local_a0 < local_3c; local_a0 = local_a0 + 1) {
    pMVar5 = &local_e8;
    ncnn::Mat::channel(pMVar5,(int)in_stack_fffffffffffffee4);
    pfVar1 = ncnn::Mat::operator_cast_to_float_(pMVar5);
    ncnn::Mat::~Mat((Mat *)0x204f82);
    local_ec = 0.0;
    local_a8 = pfVar1;
    for (local_f0 = 0; local_f0 < local_30; local_f0 = local_f0 + 1) {
      in_stack_fffffffffffffee4 = local_a8[local_f0];
      ncnn::Mat::operator[](local_18,(long)(local_a0 - local_2c));
      _Var3 = ::std::pow<float,int>(0.0,0x204ffb);
      local_ec = (float)((double)local_ec + _Var3);
    }
    dVar4 = ::std::sqrt((double)(ulong)(uint)((local_ec / (float)local_24) / (float)local_28));
    pfVar1 = ncnn::Mat::operator[](local_18,(long)local_a0);
    *pfVar1 = SUB84(dVar4,0);
  }
  return 0;
}

Assistant:

int StatisticsPooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int size = w * h;
    size_t elemsize = bottom_blob.elemsize;

    int out_channels = channels;
    if (include_stddev){
        out_channels *= 2;
    }

    top_blob.create(out_channels, elemsize, opt.blob_allocator);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++){
        const float* ptr = bottom_blob.channel(q);

        float mean = 0.f;
        for (int i=0; i<size; i++){
            mean += ptr[i];
        }
        top_blob[q] = mean / w / h;
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=channels; q<out_channels; q++){
        const float* ptr = bottom_blob.channel(q-channels);

        float std = 0.f;
        for (int i=0; i<size; i++){
            std += pow( (ptr[i] - top_blob[q-channels]), 2);
        }
        top_blob[q] = sqrt(std / w / h);
    }

    return 0;
}